

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_manager.cpp
# Opt level: O1

void __thiscall cfd::CfdManager::Finalize(CfdManager *this,bool is_finish_process)

{
  CfdSourceLocation local_28;
  
  if ((this->initialized_ == true) && (this->finalized_ == false)) {
    if (!is_finish_process) {
      local_28.filename = "cfd_manager.cpp";
      local_28.line = 0x37;
      local_28.funcname = "Finalize";
      core::logger::log<>(&local_28,kCfdLogLevelInfo,"cfd finalize.");
    }
    core::Finalize(this->handle_,is_finish_process);
    this->finalized_ = true;
    this->handle_ = (CfdCoreHandle)0x0;
  }
  return;
}

Assistant:

void CfdManager::Finalize(bool is_finish_process) {
  if (initialized_ && (!finalized_)) {
    if (!is_finish_process) {
      info(CFD_LOG_SOURCE, "cfd finalize.");
    }
    cfd::core::Finalize(handle_, is_finish_process);
    finalized_ = true;
    handle_ = nullptr;
  }
}